

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMemCheckHandler.cxx
# Opt level: O2

void __thiscall
cmBoundsCheckerParser::StartElement(cmBoundsCheckerParser *this,string *name,char **atts)

{
  bool bVar1;
  ostream *poVar2;
  ostringstream ostr;
  string asStack_1c8 [32];
  ostream local_1a8;
  
  bVar1 = std::operator==(name,"MemoryLeak");
  if (!bVar1) {
    bVar1 = std::operator==(name,"ResourceLeak");
    if (!bVar1) {
      bVar1 = std::operator==(name,"Error");
      if (!bVar1) {
        bVar1 = std::operator==(name,"Dangling Pointer");
        if (!bVar1) goto LAB_004787de;
      }
      ParseError(this,atts);
      goto LAB_004787de;
    }
  }
  local_1a8._vptr_basic_ostream._0_4_ = 0xe;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&this->Errors,(int *)&local_1a8);
LAB_004787de:
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  poVar2 = std::operator<<(&local_1a8,(string *)name);
  std::operator<<(poVar2,":\n");
  for (; *atts != (char *)0x0; atts = atts + 2) {
    poVar2 = std::operator<<(&local_1a8,"   ");
    poVar2 = std::operator<<(poVar2,*atts);
    poVar2 = std::operator<<(poVar2," - ");
    poVar2 = std::operator<<(poVar2,atts[1]);
    std::operator<<(poVar2,"\n");
  }
  std::operator<<(&local_1a8,"\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::append((string *)&this->Log);
  std::__cxx11::string::~string(asStack_1c8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  return;
}

Assistant:

void StartElement(const std::string& name, const char** atts) override
  {
    if (name == "MemoryLeak" || name == "ResourceLeak") {
      this->Errors.push_back(cmCTestMemCheckHandler::MLK);
    } else if (name == "Error" || name == "Dangling Pointer") {
      this->ParseError(atts);
    }
    // Create the log
    std::ostringstream ostr;
    ostr << name << ":\n";
    int i = 0;
    for (; atts[i] != nullptr; i += 2) {
      ostr << "   " << atts[i] << " - " << atts[i + 1] << "\n";
    }
    ostr << "\n";
    this->Log += ostr.str();
  }